

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O2

void leccalc::doit(string *subfolder,FILE **fout,bool useReturnPeriodFile,bool skipheader,
                  bool *outputFlags,bool ordFlag,string *parquetFileNames,char *progname)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool *outputFlags_00;
  FILE *pFVar4;
  DIR *__dirp;
  dirent *pdVar5;
  FILE *__stream;
  mapped_type *this;
  undefined8 uVar6;
  size_t sVar7;
  iterator iVar8;
  undefined7 in_register_00000009;
  long lVar9;
  long lVar10;
  FILE *pFVar11;
  char *pcVar12;
  _Base_ptr p_Var13;
  pointer inFile;
  uint samplesize;
  uint local_139c;
  int file_index;
  int last_summary_id;
  FILE *local_1390;
  int summary_id;
  int totalperiods;
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  out_loss;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  sampleslevelRec sr;
  FILE *in;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  indexFiles;
  string s;
  string path;
  vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_> fileHandles;
  vector<int,_std::allocator<int>_> fileIDs_agg;
  vector<int,_std::allocator<int>_> fileIDs_occ;
  longlong file_offset;
  summarySampleslevelHeader sh;
  set<int,_std::less<int>,_std::allocator<int>_> summaryids;
  longlong offset;
  pointer psStack_1210;
  pointer local_1208;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  event_to_periods;
  aggreports agg;
  string fileList;
  
  local_139c = (uint)CONCAT71(in_register_00000009,skipheader);
  std::operator+(&path,"work/",subfolder);
  std::__cxx11::string::substr((ulong)&fileList,(ulong)&path);
  bVar1 = std::operator!=(&fileList,"/");
  std::__cxx11::string::~string((string *)&fileList);
  if (bVar1) {
    std::operator+(&fileList,&path,"/");
    std::__cxx11::string::operator=((string *)&path,(string *)&fileList);
    std::__cxx11::string::~string((string *)&fileList);
  }
  event_to_periods._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &event_to_periods._M_t._M_impl.super__Rb_tree_header._M_header;
  event_to_periods._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  event_to_periods._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  event_to_periods._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  event_to_periods._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       event_to_periods._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  loadoccurrence(&event_to_periods,&totalperiods);
  std::
  vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
  ::vector(&out_loss,2,(allocator_type *)&fileList);
  local_1390 = (FILE *)CONCAT44(local_1390._4_4_,(uint)useReturnPeriodFile);
  aggreports::aggreports
            (&agg,totalperiods,fout,useReturnPeriodFile,outputFlags,ordFlag,parquetFileNames,
             progname);
  outputFlags_00 = aggreports::GetOutputFlags(&agg);
  fileIDs_occ.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  fileIDs_occ.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  fileIDs_occ.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  fileIDs_agg.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  fileIDs_agg.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  fileIDs_agg.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar1 = setupoutputfiles(fout,ordFlag,outputFlags_00,local_139c._0_1_,&fileIDs_occ,&fileIDs_agg,
                           &agg);
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fileHandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fileHandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fileHandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indexFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  indexFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  indexFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  samplesize = 0;
  summaryids._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &summaryids._M_t._M_impl.super__Rb_tree_header._M_header;
  summaryids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  summaryids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  summaryids._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_139c = (uint)bVar1;
  summaryids._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       summaryids._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (subfolder->_M_string_length == 0) {
    processinputfile(&samplesize,&event_to_periods,&summaryids,&out_loss,SUB81(local_1390,0),&agg);
LAB_00102ce5:
    outputaggreports(&agg,&summaryids,&out_loss,samplesize,&fileIDs_occ,&fileIDs_agg,
                     SUB41(local_139c,0));
LAB_00103093:
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&summaryids._M_t);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&indexFiles);
    std::_Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>::~_Vector_base
              (&fileHandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&files);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&fileIDs_agg.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&fileIDs_occ.super__Vector_base<int,_std::allocator<int>_>);
    aggreports::~aggreports(&agg);
    std::
    vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
    ::~vector(&out_loss);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(&event_to_periods._M_t);
    std::__cxx11::string::~string((string *)&path);
    return;
  }
  std::operator+(&fileList,&path,"filelist.idx");
  pFVar4 = fopen(fileList._M_dataplus._M_p,"w");
  if (pFVar4 == (FILE *)0x0) {
LAB_00103198:
    pcVar12 = "FATAL: Cannot open %s\n";
  }
  else {
    __dirp = opendir(path._M_dataplus._M_p);
    if (__dirp == (DIR *)0x0) {
      fprintf(_stderr,"FATAL: Unable to open directory %s\n",path._M_dataplus._M_p);
      goto LAB_0010316d;
    }
    while (pdVar5 = readdir(__dirp), pdVar5 != (dirent *)0x0) {
      std::__cxx11::string::string((string *)&s,pdVar5->d_name,(allocator *)&in);
      if (4 < CONCAT44(s._M_string_length._4_4_,(undefined4)s._M_string_length)) {
        std::__cxx11::string::substr((ulong)&in,(ulong)&s);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&in,".bin");
        std::__cxx11::string::~string((string *)&in);
        if (bVar1) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                         &path,pdVar5->d_name);
          std::__cxx11::string::operator=((string *)&s,(string *)&in);
          std::__cxx11::string::~string((string *)&in);
          in = (FILE *)fopen(s._M_dataplus._M_p,"rb");
          fileList._M_dataplus = s._M_dataplus;
          if ((FILE *)in == (FILE *)0x0) goto LAB_00103198;
          checkinputfile(&samplesize,in,&agg);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&files,&s);
          std::vector<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>::push_back
                    (&fileHandles,(value_type *)&in);
          fprintf(pFVar4,"%s\n",s._M_dataplus._M_p);
          std::__cxx11::string::erase
                    ((ulong)&s,CONCAT44(s._M_string_length._4_4_,(undefined4)s._M_string_length) - 4
                    );
          std::__cxx11::string::append((char *)&s);
          __stream = fopen(s._M_dataplus._M_p,"r");
          if (__stream != (FILE *)0x0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&indexFiles,&s);
            fclose(__stream);
          }
        }
      }
      std::__cxx11::string::~string((string *)&s);
    }
    fclose(pFVar4);
    std::__cxx11::string::~string((string *)&fileList);
    lVar9 = (long)files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    lVar10 = (long)indexFiles.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)indexFiles.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (lVar9 != lVar10) {
      if (indexFiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          indexFiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        fprintf(_stderr,"%d summary index files missing: Ignoring summary index files.\n",
                (ulong)(uint)((int)lVar10 - (int)lVar9));
      }
      for (inFile = files.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          inFile != files.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; inFile = inFile + 1) {
        setinputstream(inFile);
        processinputfile(&samplesize,&event_to_periods,&summaryids,&out_loss,SUB81(local_1390,0),
                         &agg);
      }
      goto LAB_00102ce5;
    }
    file_index = 0;
    s.field_2._8_8_ = &s._M_string_length;
    s._M_string_length._0_4_ = 0;
    s.field_2._M_allocated_capacity = 0;
    pFVar4 = (FILE *)indexFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
    while (pFVar4 != (FILE *)indexFiles.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish) {
      local_1390 = pFVar4;
      pFVar4 = fopen(*(char **)pFVar4,"r");
      in = (FILE *)CONCAT44(file_index,in._0_4_);
      file_index = file_index + 1;
      while (pcVar12 = fgets((char *)&fileList,0x1000,pFVar4), pcVar12 != (char *)0x0) {
        iVar2 = __isoc99_sscanf(&fileList,"%d,%lld",(key_type *)&in,&offset);
        if (iVar2 != 2) {
          pFVar11 = *(FILE **)local_1390;
          goto LAB_00103157;
        }
        this = std::
               map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               ::operator[]((map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                             *)&s,(key_type *)&in);
        std::vector<long_long,_std::allocator<long_long>_>::push_back(this,&offset);
      }
      fclose(pFVar4);
      pFVar4 = (FILE *)&local_1390->_IO_write_base;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,&path,
                   "summaries.idx");
    pFVar4 = fopen((char *)in,"w");
    if (pFVar4 != (FILE *)0x0) {
      iVar2 = -1;
      for (uVar6 = s.field_2._8_8_; (size_type *)uVar6 != &s._M_string_length;
          uVar6 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar6)) {
        for (p_Var13 = ((_Rb_tree_node_base *)(uVar6 + 0x20))->_M_parent;
            p_Var13 != ((_Rb_tree_node_base *)(uVar6 + 0x20))->_M_left;
            p_Var13 = (_Base_ptr)&p_Var13->_M_parent) {
          fprintf(pFVar4,"%d,%d,%lld\n",(ulong)((_Rb_tree_node_base *)(uVar6 + 0x20))->_M_color,
                  (ulong)*(uint *)&((_Rb_tree_node_base *)(uVar6 + 0x20))->field_0x4,
                  *(undefined8 *)p_Var13);
        }
      }
      std::
      _Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
      ::clear((_Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               *)&s);
      fclose(pFVar4);
      file_index = 0;
      last_summary_id = -1;
      local_1390 = fopen((char *)in,"r");
      pFVar4 = (FILE *)0x0;
      while( true ) {
        pcVar12 = fgets((char *)&fileList,0x1000,local_1390);
        if (pcVar12 == (char *)0x0) break;
        iVar3 = __isoc99_sscanf(&fileList,"%d,%d,%lld",&summary_id,&file_index,&file_offset);
        pFVar11 = in;
        if (iVar3 != 3) goto LAB_00103157;
        if (last_summary_id != summary_id) {
          if (last_summary_id != -1) {
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            clear((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  &summaryids);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &summaryids,&last_summary_id);
            outputaggreports(&agg,&summaryids,&out_loss,samplesize,&fileIDs_occ,&fileIDs_agg,
                             SUB41(local_139c,0));
            std::
            vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
            ::vector((vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                      *)&offset,2,(allocator_type *)&sh);
            std::
            vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
            ::_M_move_assign(&out_loss,
                             (_Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_> *)
                             &offset);
            std::
            vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
            ::~vector((vector<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>,_std::allocator<std::map<outkey2,_OutLosses,_std::less<outkey2>,_std::allocator<std::pair<const_outkey2,_OutLosses>_>_>_>_>
                       *)&offset);
          }
          last_summary_id = summary_id;
        }
        if (iVar2 != file_index) {
          pFVar4 = (FILE *)fileHandles.super__Vector_base<_IO_FILE_*,_std::allocator<_IO_FILE_*>_>.
                           _M_impl.super__Vector_impl_data._M_start[file_index];
          iVar2 = file_index;
        }
        if (pFVar4 != (FILE *)0x0) {
          offset = 0;
          psStack_1210 = (pointer)0x0;
          local_1208 = (pointer)0x0;
          fseek(pFVar4,file_offset,0);
          sVar7 = fread(&sh,0xc,1,pFVar4);
          iVar8 = std::
                  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::find(&event_to_periods._M_t,&sh.event_id);
          if ((_Rb_tree_header *)iVar8._M_node ==
              &event_to_periods._M_t._M_impl.super__Rb_tree_header) {
            std::_Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>::~_Vector_base
                      ((_Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_> *)&offset);
          }
          else {
            if (sVar7 != 0) {
              while ((sVar7 = fread(&sr,8,1,pFVar4), sVar7 == 1 && (sr.sidx != 0))) {
                if (1 < sr.sidx + 5U) {
                  dolecoutputaggsummary
                            (sh.summary_id,sr.sidx,sr.loss,
                             (vector<int,_std::allocator<int>_> *)&iVar8._M_node[1]._M_parent,
                             &out_loss);
                }
              }
            }
            std::_Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_>::~_Vector_base
                      ((_Vector_base<sampleslevelRec,_std::allocator<sampleslevelRec>_> *)&offset);
          }
        }
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &summaryids);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &summaryids,&last_summary_id);
      outputaggreports(&agg,&summaryids,&out_loss,samplesize,&fileIDs_occ,&fileIDs_agg,
                       SUB41(local_139c,0));
      std::__cxx11::string::~string((string *)&in);
      std::
      _Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                   *)&s);
      goto LAB_00103093;
    }
    pcVar12 = "Cannot open %s\n";
    fileList._M_dataplus._M_p = (pointer)in;
  }
  fprintf(_stderr,pcVar12,fileList._M_dataplus._M_p);
  iVar2 = 1;
LAB_0010316f:
  exit(iVar2);
LAB_00103157:
  fprintf(_stderr,"FATAL: Invalid data in file %s:\n%s",pFVar11,&fileList);
LAB_0010316d:
  iVar2 = -1;
  goto LAB_0010316f;
}

Assistant:

void doit(const std::string &subfolder, FILE **fout,
		  const bool useReturnPeriodFile, bool skipheader,
		  bool *outputFlags, bool ordFlag,
		  const std::string *parquetFileNames,
		  const char *progname)
	{
		std::string path = "work/" + subfolder;
		if (path.substr(path.length() - 1, 1) != "/") {
			path = path + "/";
		}
		std::map<int, std::vector<int> > event_to_periods;
		int totalperiods;
		loadoccurrence(event_to_periods, totalperiods);
		std::vector<std::map<outkey2, OutLosses>> out_loss(2);

		aggreports agg(totalperiods, fout, useReturnPeriodFile,
			       outputFlags, ordFlag, parquetFileNames,
			       progname);
		outputFlags = agg.GetOutputFlags();

		std::vector<int> fileIDs_occ, fileIDs_agg;
		bool hasEPT = setupoutputfiles(fout, ordFlag, outputFlags,
					       skipheader, fileIDs_occ,
					       fileIDs_agg, agg);

		std::vector<std::string> files;
		std::vector<FILE*> fileHandles;
		std::vector<std::string> indexFiles;
		unsigned int samplesize=0;
		std::set<int> summaryids;
		if (subfolder.size() == 0) {
			processinputfile(samplesize, event_to_periods,
					 summaryids, out_loss,
					 useReturnPeriodFile, agg);
			outputaggreports(agg, summaryids, out_loss, samplesize,
					 fileIDs_occ, fileIDs_agg, hasEPT);
			return;
		} else {
			// Store order of input files for future reference
			std::string fileList = path + "filelist.idx";
			FILE * flist = fopen(fileList.c_str(), "w");
			if (flist == nullptr) {
				fprintf(stderr, "FATAL: Cannot open %s\n", fileList.c_str());
				exit(EXIT_FAILURE);
			}
			DIR* dir;
			struct dirent* ent;
			if ((dir = opendir(path.c_str())) != NULL) {
				while ((ent = readdir(dir)) != NULL) {
					std::string s = ent->d_name;
					if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
						s = path + ent->d_name;
						FILE * in = fopen(s.c_str(), "rb");
						if (in != nullptr) {
							checkinputfile(samplesize, in, agg);
						} else {
							fprintf(stderr, "FATAL: Cannot open %s\n", s.c_str());
							exit(EXIT_FAILURE);
						}
						files.push_back(s);   // Build input file list
						fileHandles.push_back(in);
						fprintf(flist, "%s\n", s.c_str());
						// Check for index file
						s.erase(s.length() - 4);
						s += ".idx";
						FILE * fidx = fopen(s.c_str(), "r");
						if (fidx == nullptr) continue;
						indexFiles.push_back(s);
						fclose(fidx);
					}
				}
			}
			else {
				fprintf(stderr, "FATAL: Unable to open directory %s\n", path.c_str());
				exit(-1);
			}
			fclose(flist);
		}

		if (files.size() == indexFiles.size()) {
			// Combine summary index files into one master summary index file
			int file_index = 0;
			char line[4096];
			std::map<summary_keyz, std::vector<long long>> summary_file_to_offset;
			for (std::vector<std::string>::iterator it = indexFiles.begin(); it != indexFiles.end(); ++it) {
				FILE * fidx = fopen(it->c_str(), "r");
				summary_keyz summaryFile;
				summaryFile.fileindex = file_index++;
				while (fgets(line, sizeof(line), fidx) != 0) {
					long long offset;
					int ret = sscanf(line, "%d,%lld", &summaryFile.summary_id, &offset);
					if (ret != 2) {
						fprintf(stderr, "FATAL: Invalid data in file %s:\n%s",
							it->c_str(), line);
						exit(-1);
					}
					summary_file_to_offset[summaryFile].push_back(offset);
				}
				fclose(fidx);
			}
			std::string summaryFile = path + "summaries.idx";
			FILE * fsummaries = fopen(summaryFile.c_str(), "w");
			if (fsummaries == nullptr) {
				fprintf(stderr, "Cannot open %s\n", summaryFile.c_str());
				exit(EXIT_FAILURE);
			}
			for (std::map<summary_keyz, std::vector<long long>>::iterator it_s = summary_file_to_offset.begin();
			     it_s != summary_file_to_offset.end(); ++it_s) {
				for(std::vector<long long>::iterator it_v = it_s->second.begin(); it_v != it_s->second.end(); ++it_v) {
					fprintf(fsummaries, "%d,%d,%lld\n", it_s->first.summary_id, it_s->first.fileindex, *it_v);
				}
			}
			summary_file_to_offset.clear();   // Recover memory
			fclose(fsummaries);

			// Read input files by summary ID using master summary index file
			int summary_id;
			file_index = 0;
			long long file_offset;
			int last_summary_id = -1;
			int last_file_index = -1;
			FILE * fidx = fopen(summaryFile.c_str(), "r");
			FILE * summary_fin = nullptr;
			while (fgets(line, sizeof(line), fidx) != 0) {
				int ret = sscanf(line, "%d,%d,%lld", &summary_id, &file_index, &file_offset);
				if (ret != 3) {
					fprintf(stderr, "FATAL: Invalid data in file %s:\n%s", summaryFile.c_str(), line);
					exit(-1);
				}
				if (last_summary_id != summary_id) {
					if (last_summary_id != -1) {
						summaryids.clear();
						summaryids.insert(last_summary_id);
						outputaggreports(agg, summaryids, out_loss, samplesize, fileIDs_occ, fileIDs_agg, hasEPT);
						out_loss = std::vector<std::map<outkey2, OutLosses>>(2);   // Reset
						skipheader = true;   // Only print header for first summary ID if requested
					}
					last_summary_id = summary_id;
				}
				if (last_file_index != file_index) {
					summary_fin = fileHandles[file_index];
					last_file_index = file_index;
				}
				if (summary_fin != nullptr) {
					std::vector<sampleslevelRec> vrec;
					flseek(summary_fin, file_offset, SEEK_SET);
					summarySampleslevelHeader sh;
					size_t i = fread(&sh, sizeof(sh), 1, summary_fin);
					std::map<int, std::vector<int> >::const_iterator iter = event_to_periods.find(sh.event_id);
					if (iter == event_to_periods.end()) continue;   // Event not found so don't process it
					while (i != 0) {
						sampleslevelRec sr;
						i = fread(&sr, sizeof(sr), 1, summary_fin);
						if (i != 1 || sr.sidx == 0) break;
						if (sr.sidx == number_of_affected_risk_idx || sr.sidx == max_loss_idx) continue;
						dolecoutputaggsummary(sh.summary_id, sr.sidx, sr.loss, iter->second, out_loss);
					}
				}
			}
			summaryids.clear();
			summaryids.insert(last_summary_id);
			outputaggreports(agg, summaryids, out_loss, samplesize,
					 fileIDs_occ, fileIDs_agg, hasEPT);
		} else {
			if (indexFiles.size() > 0) {
				fprintf(stderr, "%d summary index files missing: "
						"Ignoring summary index files.\n",
					(int)indexFiles.size() - (int)files.size());
			}
			for (std::vector<std::string>::iterator it = files.begin(); it != files.end(); ++it) {
				setinputstream(*it);
				processinputfile(samplesize, event_to_periods,
						 summaryids, out_loss,
						 useReturnPeriodFile, agg);
			}
			outputaggreports(agg, summaryids, out_loss, samplesize,
					 fileIDs_occ, fileIDs_agg, hasEPT);
		}
	}